

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O2

EVaction INT_EVassoc_split_action(CManager_conflict cm,EVstone stone_num,EVstone *target_stone_list)

{
  attr_list *pp_Var1;
  undefined8 *puVar2;
  void **ppvVar3;
  int iVar4;
  event_path_data evp;
  int iVar5;
  stone_type stone;
  long lVar6;
  _proto_action *p_Var7;
  ulong uVar8;
  FILE *__stream;
  ulong uVar9;
  
  evp = cm->evp;
  stone = stone_struct(evp,stone_num);
  if (stone == (stone_type)0x0) {
    return -1;
  }
  iVar4 = stone->proto_action_count;
  lVar6 = (long)iVar4;
  p_Var7 = (_proto_action *)INT_CMrealloc(stone->proto_actions,lVar6 * 0x60 + 0x60);
  stone->proto_actions = p_Var7;
  *(undefined8 *)(p_Var7 + lVar6) = 0;
  p_Var7[lVar6].input_format_requirements = (FMStructDescList)0x0;
  p_Var7[lVar6].attrs = (attr_list)0x0;
  (&p_Var7[lVar6].attrs)[1] = (attr_list)0x0;
  pp_Var1 = &p_Var7[lVar6].o.bri.remote_contact;
  *pp_Var1 = (attr_list)0x0;
  pp_Var1[1] = (attr_list)0x0;
  puVar2 = (undefined8 *)((long)&p_Var7[lVar6].o + 0x18);
  *puVar2 = 0;
  puVar2[1] = 0;
  ppvVar3 = &p_Var7[lVar6].o.term.client_data;
  *ppvVar3 = (void *)0x0;
  ppvVar3[1] = (void *)0x0;
  p_Var7[lVar6].matching_reference_formats = (FMFormat *)0x0;
  (((anon_union_48_6_c1ce387a_for_o *)(&p_Var7[lVar6].matching_reference_formats + 1))->term).
  handler = (EVSimpleHandlerFunc)0x0;
  stone->proto_actions[lVar6].action_type = Action_Split;
  for (uVar9 = 0; (target_stone_list != (EVstone *)0x0 && (target_stone_list[uVar9] != -1));
      uVar9 = uVar9 + 1) {
  }
  __stream = (FILE *)cm->CMTrace_file;
  if (__stream == (FILE *)0x0) {
    iVar5 = CMtrace_init(cm,EVerbose);
    if (iVar5 == 0) goto LAB_0012ddb7;
    __stream = (FILE *)cm->CMTrace_file;
  }
  else if (CMtrace_val[10] == 0) goto LAB_0012ddb7;
  fprintf(__stream,"Adding Split action %d to ",lVar6);
  fprint_stone_identifier(cm->CMTrace_file,evp,stone_num);
  fprintf((FILE *)cm->CMTrace_file,", %d target stones -> ",uVar9 & 0xffffffff);
  for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
    fprintf((FILE *)cm->CMTrace_file,"%x, ",(ulong)(uint)target_stone_list[uVar8]);
  }
  fputc(10,(FILE *)cm->CMTrace_file);
LAB_0012ddb7:
  for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
    INT_EVstone_add_split_target(cm,stone_num,target_stone_list[uVar8]);
  }
  stone->output_count = (int)uVar9;
  stone->default_action = iVar4;
  stone->proto_action_count = stone->proto_action_count + 1;
  clear_response_cache(stone);
  return iVar4;
}

Assistant:

extern EVaction
INT_EVassoc_split_action(CManager cm, EVstone stone_num, 
		     EVstone *target_stone_list)
{
    event_path_data evp = cm->evp;
    stone_type stone;
    int action_num;
    int target_count = 0, i;

    stone = stone_struct(evp, stone_num);
    if (!stone) return -1;

    action_num = stone->proto_action_count;
    stone->proto_actions = realloc(stone->proto_actions, 
				   (action_num + 1) * 
				   sizeof(stone->proto_actions[0]));
    memset(&stone->proto_actions[action_num], 0, 
	   sizeof(stone->proto_actions[0]));
    stone->proto_actions[action_num].action_type = Action_Split;
    while (target_stone_list && (target_stone_list[target_count] != -1)) {
	target_count++;
    }
    if (CMtrace_on(cm, EVerbose)) {
	fprintf(cm->CMTrace_file, "Adding Split action %d to ", action_num);
	fprint_stone_identifier(cm->CMTrace_file, evp, stone_num);
	fprintf(cm->CMTrace_file, ", %d target stones -> ", target_count);
	for (i=0; i < target_count; i++) {
	    fprintf(cm->CMTrace_file, "%x, ", target_stone_list[i]);
	}
	fprintf(cm->CMTrace_file, "\n");
    }
    for (i=0; i < target_count; i++) {
	INT_EVstone_add_split_target(cm, stone_num, target_stone_list[i]);
    }
    stone->output_count = target_count;
    stone->default_action = action_num;
    stone->proto_action_count++;
    clear_response_cache(stone);
    return action_num;
}